

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

void __thiscall llvm::APFloat::makeNaN(APFloat *this,bool SNaN,bool Neg,APInt *fill)

{
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::makeNaN(&(this->U).IEEE,SNaN,Neg,fill);
    return;
  }
  makeNaN((APFloat *)(this->U).IEEE.significand.parts,SNaN,Neg,fill);
  makeZero((APFloat *)((this->U).IEEE.significand.part + 0x20),false);
  return;
}

Assistant:

void makeNaN(bool SNaN, bool Neg, const APInt *fill) {
    APFLOAT_DISPATCH_ON_SEMANTICS(makeNaN(SNaN, Neg, fill));
  }